

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O0

void __thiscall
Js::PropertyDescriptor::SetAttributes
          (PropertyDescriptor *this,PropertyAttributes attributes,PropertyAttributes mask)

{
  PropertyAttributes mask_local;
  PropertyAttributes attributes_local;
  PropertyDescriptor *this_local;
  
  if ((mask & 2) != 0) {
    SetConfigurable(this,(attributes & 2) != 0);
  }
  if ((mask & 1) != 0) {
    SetEnumerable(this,(attributes & 1) != 0);
  }
  if ((mask & 4) != 0) {
    SetWritable(this,(attributes & 4) != 0);
  }
  return;
}

Assistant:

void PropertyDescriptor::SetAttributes(PropertyAttributes attributes, PropertyAttributes mask)
    {
        if (mask & PropertyConfigurable)
        {
            this->SetConfigurable(PropertyNone != (attributes & PropertyConfigurable));
        }
        if (mask & PropertyEnumerable)
        {
            this->SetEnumerable(PropertyNone != (attributes & PropertyEnumerable));
        }
        if (mask & PropertyWritable)
        {
            this->SetWritable(PropertyNone != (attributes & PropertyWritable));
        }
    }